

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# export.cc
# Opt level: O3

pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* anon_unknown.dwarf_19656::getIDLBase
            (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *__return_storage_ptr__,Type *type,IDLExport *exporter,string *field_name)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  undefined8 *puVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  size_type sVar4;
  undefined8 *puVar5;
  long *plVar6;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *extraout_RAX;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *extraout_RAX_00;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *extraout_RAX_01;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *ppVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  ulong uVar10;
  undefined8 uVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  IDLTypeIdentifierVisitor visitor;
  string type_name;
  string local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  undefined8 *local_120;
  undefined8 local_118;
  undefined8 local_110;
  undefined8 uStack_108;
  ulong *local_100;
  long local_f8;
  ulong local_f0 [2];
  string local_e0;
  undefined **local_c0;
  IDLExport *local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  undefined1 local_90 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  undefined1 local_60 [16];
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40 [16];
  
  local_50 = local_40;
  local_48 = 0;
  local_40[0] = 0;
  local_c0 = &PTR_visit__0011d820;
  local_b0._M_string_length = 0;
  local_b0.field_2._M_local_buf[0] = '\0';
  local_90._0_8_ = local_90 + 0x10;
  local_90._8_8_ = 0;
  local_90[0x10] = '\0';
  local_70._M_allocated_capacity = (size_type)local_60;
  local_70._8_8_ = 0;
  local_60[0] = 0;
  local_b8 = exporter;
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  Typelib::Type::getNamespace_abi_cxx11_();
  getIDLAbsoluteNamespace
            (&local_160,(anon_unknown_dwarf_19656 *)local_140._M_dataplus._M_p,
             (string *)local_140._M_string_length,local_b8);
  std::__cxx11::string::operator=((string *)local_70._M_local_buf,(string *)&local_160);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != &local_160.field_2) {
    operator_delete(local_160._M_dataplus._M_p);
  }
  paVar1 = &local_140.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._M_dataplus._M_p != paVar1) {
    operator_delete(local_140._M_dataplus._M_p);
  }
  Typelib::TypeVisitor::apply((Type *)&local_c0);
  normalizeIDLName(&local_160,(anon_unknown_dwarf_19656 *)local_b0._M_dataplus._M_p,
                   (string *)local_b0._M_string_length);
  std::__cxx11::string::operator=((string *)&local_b0,(string *)&local_160);
  paVar3 = &local_160.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != paVar3) {
    operator_delete(local_160._M_dataplus._M_p);
  }
  local_160._M_dataplus._M_p = (pointer)paVar3;
  if (field_name->_M_string_length == 0) {
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_160,local_70._M_allocated_capacity,
               (undefined1 *)(local_70._8_8_ + local_70._M_allocated_capacity));
    std::operator+(&local_140,&local_b0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90);
    paVar1 = &(__return_storage_ptr__->first).field_2;
    (__return_storage_ptr__->first)._M_dataplus._M_p = (pointer)paVar1;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_160._M_dataplus._M_p == paVar3) {
      paVar1->_M_allocated_capacity =
           CONCAT71(local_160.field_2._M_allocated_capacity._1_7_,local_160.field_2._M_local_buf[0])
      ;
      *(undefined8 *)((long)&(__return_storage_ptr__->first).field_2 + 8) = local_160.field_2._8_8_;
    }
    else {
      (__return_storage_ptr__->first)._M_dataplus._M_p = local_160._M_dataplus._M_p;
      (__return_storage_ptr__->first).field_2._M_allocated_capacity =
           CONCAT71(local_160.field_2._M_allocated_capacity._1_7_,local_160.field_2._M_local_buf[0])
      ;
    }
    (__return_storage_ptr__->first)._M_string_length = local_160._M_string_length;
    paVar1 = &(__return_storage_ptr__->second).field_2;
    (__return_storage_ptr__->second)._M_dataplus._M_p = (pointer)paVar1;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p == &local_140.field_2) {
      paVar1->_M_allocated_capacity = local_140.field_2._M_allocated_capacity;
      *(undefined8 *)((long)&(__return_storage_ptr__->second).field_2 + 8) = local_140.field_2._8_8_
      ;
    }
    else {
      (__return_storage_ptr__->second)._M_dataplus._M_p = local_140._M_dataplus._M_p;
      (__return_storage_ptr__->second).field_2._M_allocated_capacity =
           local_140.field_2._M_allocated_capacity;
    }
    (__return_storage_ptr__->second)._M_string_length = local_140._M_string_length;
    goto LAB_0010fabe;
  }
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_160,local_70._M_allocated_capacity,
             (undefined1 *)(local_70._8_8_ + local_70._M_allocated_capacity));
  local_100 = local_f0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_100,local_b0._M_dataplus._M_p,
             local_b0._M_dataplus._M_p + (long)(_Alloc_hider *)local_b0._M_string_length);
  std::__cxx11::string::append((char *)&local_100);
  stripLeadingUnderscore(&local_e0,field_name);
  uVar10 = 0xf;
  if (local_100 != local_f0) {
    uVar10 = local_f0[0];
  }
  if (uVar10 < local_e0._M_string_length + local_f8) {
    uVar11 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
      uVar11 = local_e0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar11 < local_e0._M_string_length + local_f8) goto LAB_0010f86a;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_e0,0,(char *)0x0,(ulong)local_100);
  }
  else {
LAB_0010f86a:
    puVar5 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_100,(ulong)local_e0._M_dataplus._M_p);
  }
  local_120 = &local_110;
  puVar2 = puVar5 + 2;
  if ((undefined8 *)*puVar5 == puVar2) {
    local_110 = *puVar2;
    uStack_108 = puVar5[3];
  }
  else {
    local_110 = *puVar2;
    local_120 = (undefined8 *)*puVar5;
  }
  local_118 = puVar5[1];
  *puVar5 = puVar2;
  puVar5[1] = 0;
  *(undefined1 *)puVar2 = 0;
  plVar6 = (long *)std::__cxx11::string::_M_append((char *)&local_120,local_90._0_8_);
  paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 == paVar9) {
    local_140.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
    local_140.field_2._8_8_ = plVar6[3];
    paVar8 = paVar1;
  }
  else {
    local_140.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
    paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)*plVar6;
  }
  sVar4 = plVar6[1];
  *plVar6 = (long)paVar9;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  paVar9 = &(__return_storage_ptr__->first).field_2;
  (__return_storage_ptr__->first)._M_dataplus._M_p = (pointer)paVar9;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p == paVar3) {
    paVar9->_M_allocated_capacity =
         CONCAT71(local_160.field_2._M_allocated_capacity._1_7_,local_160.field_2._M_local_buf[0]);
    *(undefined8 *)((long)&(__return_storage_ptr__->first).field_2 + 8) = local_160.field_2._8_8_;
  }
  else {
    (__return_storage_ptr__->first)._M_dataplus._M_p = local_160._M_dataplus._M_p;
    (__return_storage_ptr__->first).field_2._M_allocated_capacity =
         CONCAT71(local_160.field_2._M_allocated_capacity._1_7_,local_160.field_2._M_local_buf[0]);
  }
  (__return_storage_ptr__->first)._M_string_length = local_160._M_string_length;
  local_160._M_string_length = 0;
  local_160.field_2._M_local_buf[0] = '\0';
  paVar9 = &(__return_storage_ptr__->second).field_2;
  (__return_storage_ptr__->second)._M_dataplus._M_p = (pointer)paVar9;
  if (paVar8 == paVar1) {
    paVar9->_M_allocated_capacity = local_140.field_2._M_allocated_capacity;
    *(undefined8 *)((long)&(__return_storage_ptr__->second).field_2 + 8) = local_140.field_2._8_8_;
  }
  else {
    (__return_storage_ptr__->second)._M_dataplus._M_p = (pointer)paVar8;
    (__return_storage_ptr__->second).field_2._M_allocated_capacity =
         local_140.field_2._M_allocated_capacity;
  }
  (__return_storage_ptr__->second)._M_string_length = sVar4;
  local_140._M_string_length = 0;
  local_140.field_2._M_allocated_capacity =
       local_140.field_2._M_allocated_capacity & 0xffffffffffffff00;
  local_160._M_dataplus._M_p = (pointer)paVar3;
  local_140._M_dataplus._M_p = (pointer)paVar1;
  if (local_120 != &local_110) {
    operator_delete(local_120);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
    operator_delete(local_e0._M_dataplus._M_p);
  }
  if (local_100 != local_f0) {
    operator_delete(local_100);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != paVar3) {
    operator_delete(local_160._M_dataplus._M_p);
  }
LAB_0010fabe:
  local_c0 = &PTR_visit__0011d820;
  if ((undefined1 *)local_70._M_allocated_capacity != local_60) {
    operator_delete((void *)local_70._M_allocated_capacity);
  }
  ppVar7 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)(local_90 + 0x10);
  if ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       *)local_90._0_8_ != ppVar7) {
    operator_delete((void *)local_90._0_8_);
    ppVar7 = extraout_RAX;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p);
    ppVar7 = extraout_RAX_00;
  }
  if (local_50 != local_40) {
    operator_delete(local_50);
    ppVar7 = extraout_RAX_01;
  }
  return ppVar7;
}

Assistant:

static pair<string, string> getIDLBase(Type const& type, IDLExport const& exporter,
                                           std::string const& field_name = std::string())
    {
        std::string type_name;
        IDLTypeIdentifierVisitor visitor(exporter);

        visitor.apply(type);
        if (field_name.empty()) {
            return make_pair(visitor.getTargetNamespace(),
                             visitor.m_front + visitor.m_back);
        } else {
            return make_pair(visitor.getTargetNamespace(),
                             visitor.m_front + " " + stripLeadingUnderscore(field_name) +
                             visitor.m_back);
        }
    }